

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.hpp
# Opt level: O1

bool __thiscall ItemSource::is_npc_reward(ItemSource *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*this->_vptr_ItemSource[2])(&local_30,this);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_30,"reward");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 0;
}

Assistant:

[[nodiscard]] bool is_npc_reward() const { return this->type_name() == ITEM_SOURCE_TYPE_REWARD; }